

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd256.c
# Opt level: O0

int rmd256_init(hash_state *md)

{
  undefined8 *in_RDI;
  
  if (in_RDI == (undefined8 *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd256.c",0x119);
  }
  *(undefined4 *)((long)in_RDI + 0x4c) = 0x67452301;
  *(undefined4 *)(in_RDI + 10) = 0xefcdab89;
  *(undefined4 *)((long)in_RDI + 0x54) = 0x98badcfe;
  *(undefined4 *)(in_RDI + 0xb) = 0x10325476;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0x76543210;
  *(undefined4 *)(in_RDI + 0xc) = 0xfedcba98;
  *(undefined4 *)((long)in_RDI + 100) = 0x89abcdef;
  *(undefined4 *)(in_RDI + 0xd) = 0x1234567;
  *(undefined4 *)(in_RDI + 9) = 0;
  *in_RDI = 0;
  return 0;
}

Assistant:

int rmd256_init(hash_state * md)
{
   LTC_ARGCHK(md != NULL);
   md->rmd256.state[0] = 0x67452301UL;
   md->rmd256.state[1] = 0xefcdab89UL;
   md->rmd256.state[2] = 0x98badcfeUL;
   md->rmd256.state[3] = 0x10325476UL;
   md->rmd256.state[4] = 0x76543210UL;
   md->rmd256.state[5] = 0xfedcba98UL;
   md->rmd256.state[6] = 0x89abcdefUL;
   md->rmd256.state[7] = 0x01234567UL;
   md->rmd256.curlen   = 0;
   md->rmd256.length   = 0;
   return CRYPT_OK;
}